

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_xattr_platform.c
# Opt level: O3

void test_xattr_platform(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *paVar3;
  archive_entry *paVar4;
  void *_v1;
  longlong v1;
  void *value;
  size_t size;
  char *name;
  size_t insize;
  char *local_50;
  size_t local_48;
  char *local_40;
  size_t local_38;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                      ,L',',"readtest",L'Ƥ',L'\xffffffff',"a");
  wVar1 = setXattr("readtest","user.libarchive.test","readval",8);
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                   ,L'/');
    test_skipping("Extended attributes are not supported on this filesystem");
    return;
  }
  paVar3 = archive_read_disk_new();
  v1 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                   ,L'5',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_read_disk_new())",
                   (void *)0x0);
  paVar4 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                   ,L'7',(uint)(paVar4 != (archive_entry *)0x0),"ae != NULL",(void *)0x0);
  archive_entry_set_pathname(paVar4,"readtest");
  iVar2 = archive_read_disk_entry_from_file(paVar3,paVar4,-1,(stat_conflict *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                      ,L':',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_disk_entry_from_file(a, ae, -1, NULL)",(void *)0x0);
  wVar1 = archive_entry_xattr_reset(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                   ,L'<',(uint)(L'\0' < wVar1),"e > 0",(void *)0x0);
  wVar1 = archive_entry_xattr_next(paVar4,&local_40,&local_50,&local_48);
  if (wVar1 == L'\0') {
    do {
      if (((local_40 != (char *)0x0) && (local_50 != (char *)0x0)) && (local_48 != 0)) {
        iVar2 = strcmp(local_40,"user.libarchive.test");
        if (iVar2 == 0) {
          failure("Attribute value does not match");
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                     ,L'D',local_50,"(const char *)value","readval","readval",(void *)0x0,L'\0');
          v1 = 1;
          goto LAB_002205f7;
        }
      }
      wVar1 = archive_entry_xattr_next(paVar4,&local_40,&local_50,&local_48);
    } while (wVar1 == L'\0');
    v1 = 0;
  }
LAB_002205f7:
  failure("Attribute not found: %s","user.libarchive.test");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                      ,L'J',v1,"r",1,"1",(void *)0x0);
  archive_entry_free(paVar4);
  iVar2 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  paVar3 = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                   ,L'O',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_write_disk_new())",
                   (void *)0x0);
  archive_write_disk_set_options(paVar3,L'\x86');
  paVar4 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                   ,L'U',(uint)(paVar4 != (archive_entry *)0x0),"ae != NULL",(void *)0x0);
  archive_entry_set_pathname(paVar4,"writetest");
  archive_entry_set_filetype(paVar4,0x8000);
  archive_entry_set_perm(paVar4,0x1ac);
  archive_entry_set_mtime(paVar4,0x1e240,0x1ed2);
  archive_entry_set_size(paVar4,0);
  archive_entry_xattr_add_entry(paVar4,"user.libarchive.test","writeval",9);
  iVar2 = archive_write_header(paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                      ,L']',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar3);
  archive_entry_free(paVar4);
  iVar2 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar3);
  iVar2 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  _v1 = getXattr("writetest","user.libarchive.test",&local_38);
  wVar1 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                              ,L'c',local_38,"insize",9,"strlen(writeval) + 1",(void *)0x0);
  if (wVar1 != L'\0') {
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                        ,L'd',_v1,"rvalue","writeval","writeval",local_38,"insize",(void *)0x0);
  }
  free(_v1);
  return;
}

Assistant:

DEFINE_TEST(test_xattr_platform)
{
#if !ARCHIVE_XATTR_SUPPORT
	skipping("Extended attributes are not supported on this platform");
#else /* ARCHIVE_XATTR_SUPPORT */
	struct archive *a;
	struct archive_entry *ae;
	const char *name;
	const void *value;
	void *rvalue;
	size_t size, insize;
	int e, r;
	const char *attrname = "user.libarchive.test";
	const char *readval = "readval";
	const char *writeval = "writeval";

	assertMakeFile("readtest", 0644, "a");

	if (!setXattr("readtest", attrname, readval, strlen(readval) + 1)) {
		skipping("Extended attributes are not supported on this "
		    "filesystem");
		return;
	}

	/* Read test */
	assert(NULL != (a = archive_read_disk_new()));
	ae = archive_entry_new();
	assert(ae != NULL);
	archive_entry_set_pathname(ae, "readtest");
	assertEqualInt(ARCHIVE_OK,
		archive_read_disk_entry_from_file(a, ae, -1, NULL));
	e = archive_entry_xattr_reset(ae);
	assert(e > 0);

	r = 0;
	while (archive_entry_xattr_next(ae, &name, &value,
	    &size) == ARCHIVE_OK) {
		if (name != NULL && value != NULL && size > 0 &&
		    strcmp(name, attrname) == 0) {
			failure("Attribute value does not match");
			assertEqualString((const char *)value, readval);
			r = 1;
			break;
		}
	}
	failure("Attribute not found: %s", attrname);
	assertEqualInt(r, 1);

	archive_entry_free(ae);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	assert(NULL != (a = archive_write_disk_new()));
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_TIME |
	    ARCHIVE_EXTRACT_PERM | ARCHIVE_EXTRACT_XATTR);

	/* Write test */
	ae = archive_entry_new();
	assert(ae != NULL);
	archive_entry_set_pathname(ae, "writetest");
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_perm(ae, 0654);
	archive_entry_set_mtime(ae, 123456, 7890);
	archive_entry_set_size(ae, 0);
	archive_entry_xattr_add_entry(ae, attrname, writeval,
	    strlen(writeval) + 1);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	rvalue = getXattr("writetest", attrname, &insize);
	if (assertEqualInt(insize, strlen(writeval) + 1) != 0)
		assertEqualMem(rvalue, writeval, insize);
	free(rvalue);
#endif
}